

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O1

ssize_t __thiscall
twitter::zipkin::thrift::Span::read(Span *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 *puVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pAVar4;
  pointer pAVar5;
  vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  *pvVar6;
  vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  *pvVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  long lVar12;
  pointer pBVar13;
  pointer pAVar14;
  uint32_t _size12;
  int16_t fid;
  string fname;
  TType _etype15;
  TType ftype;
  uint local_b0;
  ushort local_aa;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [4];
  int local_84;
  int64_t *local_80;
  string *local_78;
  int64_t *local_70;
  int64_t *local_68;
  vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  *local_60;
  vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  *local_58;
  bool *local_50;
  int64_t *local_48;
  int64_t *local_40;
  int64_t *local_38;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  iVar8 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_a8);
  local_38 = &this->trace_id_high;
  local_40 = &this->duration;
  local_48 = &this->timestamp;
  local_50 = &this->debug;
  local_58 = &this->binary_annotations;
  local_60 = &this->annotations;
  local_68 = &this->parent_id;
  local_70 = &this->id;
  local_78 = &this->name;
  local_80 = &this->trace_id;
  do {
    iVar9 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_a8,&local_84,&local_aa);
    iVar9 = iVar9 + iVar8;
    if (local_84 == 0) {
      iVar8 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar8 + iVar9);
    }
    switch(local_aa) {
    case 1:
      if (local_84 != 10) {
        iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
        break;
      }
      iVar10 = (*this_00->_vptr_TProtocol[0x28])(this_00,local_80);
      iVar10 = iVar10 + iVar9;
      *(byte *)&this->__isset = *(byte *)&this->__isset | 1;
      goto LAB_0020fd79;
    default:
      iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      break;
    case 3:
      if (local_84 == 0xb) {
        iVar10 = (*this_00->_vptr_TProtocol[0x2a])(this_00,local_78);
        iVar10 = iVar10 + iVar9;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 2;
        goto LAB_0020fd79;
      }
      iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      break;
    case 4:
      if (local_84 == 10) {
        iVar10 = (*this_00->_vptr_TProtocol[0x28])(this_00,local_70);
        iVar10 = iVar10 + iVar9;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 4;
        goto LAB_0020fd79;
      }
      iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      break;
    case 5:
      if (local_84 == 10) {
        iVar10 = (*this_00->_vptr_TProtocol[0x28])(this_00,local_68);
        iVar10 = iVar10 + iVar9;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 8;
        goto LAB_0020fd79;
      }
      iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      break;
    case 6:
      if (local_84 == 0xf) {
        pAVar4 = (this->annotations).
                 super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pAVar5 = (this->annotations).
                 super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pAVar14 = pAVar4;
        if (pAVar5 != pAVar4) {
          do {
            (*(code *)**(undefined8 **)pAVar14)(pAVar14);
            pAVar14 = pAVar14 + 1;
          } while (pAVar14 != pAVar5);
          (this->annotations).
          super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_finish = pAVar4;
        }
        iVar8 = (*this_00->_vptr_TProtocol[0x1f])(this_00,local_88,&local_b0);
        pvVar6 = local_60;
        std::
        vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
        ::resize(local_60,(ulong)local_b0);
        iVar8 = iVar8 + iVar9;
        if (local_b0 != 0) {
          lVar12 = 0;
          uVar11 = 0;
          do {
            pAVar4 = (pvVar6->
                     super__Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            iVar9 = (**(code **)(*(long *)(&pAVar4->field_0x0 + lVar12) + 0x10))
                              (&pAVar4->field_0x0 + lVar12,this_00);
            iVar8 = iVar8 + iVar9;
            uVar11 = uVar11 + 1;
            lVar12 = lVar12 + 0x90;
          } while (uVar11 < local_b0);
        }
        iVar10 = (*this_00->_vptr_TProtocol[0x20])(this_00);
        iVar10 = iVar10 + iVar8;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x10;
        goto LAB_0020fd79;
      }
      iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      break;
    case 8:
      if (local_84 == 0xf) {
        pBVar2 = (this->binary_annotations).
                 super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar3 = (this->binary_annotations).
                 super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar13 = pBVar2;
        if (pBVar3 != pBVar2) {
          do {
            (*(code *)**(undefined8 **)pBVar13)(pBVar13);
            pBVar13 = pBVar13 + 1;
          } while (pBVar13 != pBVar3);
          (this->binary_annotations).
          super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
          ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
        }
        iVar8 = (*this_00->_vptr_TProtocol[0x1f])(this_00,local_88,&local_b0);
        pvVar7 = local_58;
        std::
        vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
        ::resize(local_58,(ulong)local_b0);
        iVar8 = iVar8 + iVar9;
        if (local_b0 != 0) {
          lVar12 = 0;
          uVar11 = 0;
          do {
            pBVar2 = (pvVar7->
                     super__Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            iVar9 = (**(code **)(*(long *)(&pBVar2->field_0x0 + lVar12) + 0x10))
                              (&pBVar2->field_0x0 + lVar12,this_00);
            iVar8 = iVar8 + iVar9;
            uVar11 = uVar11 + 1;
            lVar12 = lVar12 + 0xb0;
          } while (uVar11 < local_b0);
        }
        iVar10 = (*this_00->_vptr_TProtocol[0x20])(this_00);
        iVar10 = iVar10 + iVar8;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x20;
        goto LAB_0020fd79;
      }
      iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      break;
    case 9:
      if (local_84 == 2) {
        iVar10 = (*this_00->_vptr_TProtocol[0x23])(this_00,local_50);
        iVar10 = iVar10 + iVar9;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x40;
        goto LAB_0020fd79;
      }
      iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      break;
    case 10:
      if (local_84 == 10) {
        iVar10 = (*this_00->_vptr_TProtocol[0x28])(this_00,local_48);
        iVar10 = iVar10 + iVar9;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x80;
        goto LAB_0020fd79;
      }
      iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      break;
    case 0xb:
      if (local_84 == 10) {
        iVar10 = (*this_00->_vptr_TProtocol[0x28])(this_00,local_40);
        iVar10 = iVar10 + iVar9;
        puVar1 = &(this->__isset).field_0x1;
        *puVar1 = *puVar1 | 1;
        goto LAB_0020fd79;
      }
      iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      break;
    case 0xc:
      if (local_84 == 10) {
        iVar10 = (*this_00->_vptr_TProtocol[0x28])(this_00,local_38);
        iVar10 = iVar10 + iVar9;
        puVar1 = &(this->__isset).field_0x1;
        *puVar1 = *puVar1 | 2;
        goto LAB_0020fd79;
      }
      iVar10 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
    }
    iVar10 = iVar10 + iVar9;
LAB_0020fd79:
    iVar8 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar8 = iVar8 + iVar10;
  } while( true );
}

Assistant:

uint32_t Span::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->trace_id);
          this->__isset.trace_id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->name);
          this->__isset.name = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->id);
          this->__isset.id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->parent_id);
          this->__isset.parent_id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->annotations.clear();
            uint32_t _size7;
            ::apache::thrift::protocol::TType _etype10;
            xfer += iprot->readListBegin(_etype10, _size7);
            this->annotations.resize(_size7);
            uint32_t _i11;
            for (_i11 = 0; _i11 < _size7; ++_i11)
            {
              xfer += this->annotations[_i11].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.annotations = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->binary_annotations.clear();
            uint32_t _size12;
            ::apache::thrift::protocol::TType _etype15;
            xfer += iprot->readListBegin(_etype15, _size12);
            this->binary_annotations.resize(_size12);
            uint32_t _i16;
            for (_i16 = 0; _i16 < _size12; ++_i16)
            {
              xfer += this->binary_annotations[_i16].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.binary_annotations = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->debug);
          this->__isset.debug = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->timestamp);
          this->__isset.timestamp = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 11:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->duration);
          this->__isset.duration = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 12:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->trace_id_high);
          this->__isset.trace_id_high = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}